

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrInteractionProfileSuggestedBinding *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  long lVar3;
  XrResult XVar4;
  ulong uVar5;
  allocator local_189;
  GenValidUsageXrInstanceInfo *local_188;
  string *local_180;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_178;
  allocator local_169;
  string local_168;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  string local_e8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  XVar2 = XR_SUCCESS;
  local_188 = instance_info;
  local_180 = command_name;
  local_178 = objects_info;
  if (value->type != XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrInteractionProfileSuggestedBinding",
               value->type,"VUID-XrInteractionProfileSuggestedBinding-type-type",
               XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING,
               "XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING");
  }
  if (!check_pnext) goto LAB_00147314;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c9ec0;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  NVar1 = ValidateNextChain(local_188,local_180,local_178,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_168);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_168,local_188,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::string
              ((string *)&local_168,"VUID-XrInteractionProfileSuggestedBinding-next-unique",
               &local_189);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,local_178);
    std::__cxx11::string::string
              ((string *)&local_e8,
               "Multiple structures of the same type(s) in \"next\" chain for XrInteractionProfileSuggestedBinding struct"
               ,&local_169);
    CoreValidLogMessage(local_188,&local_168,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_180,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    std::__cxx11::string::~string((string *)&local_168);
LAB_001472e2:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrInteractionProfileSuggestedBinding-next-next",
               (allocator *)&local_e8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,local_178);
    std::__cxx11::string::string
              ((string *)&local_168,
               "Invalid structure(s) in \"next\" chain for XrInteractionProfileSuggestedBinding struct \"next\""
               ,&local_189);
    CoreValidLogMessage(local_188,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_180,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_48);
    goto LAB_001472e2;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_00147314:
  if (check_members && XVar2 == XR_SUCCESS) {
    XVar2 = XR_SUCCESS;
    if ((value->countSuggestedBindings == 0) &&
       (value->suggestedBindings != (XrActionSuggestedBinding *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrInteractionProfileSuggestedBinding-countSuggestedBindings-arraylength",
                 (allocator *)&local_e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,local_178);
      std::__cxx11::string::string
                ((string *)&local_168,
                 "Structure XrInteractionProfileSuggestedBinding member countSuggestedBindings is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_188,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_180,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_78);
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->suggestedBindings == (XrActionSuggestedBinding *)0x0) {
      if (value->countSuggestedBindings != 0) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrInteractionProfileSuggestedBinding-suggestedBindings-parameter",
                   (allocator *)&local_e8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_90,local_178);
        std::__cxx11::string::string
                  ((string *)&local_168,
                   "XrInteractionProfileSuggestedBinding contains invalid NULL for XrActionSuggestedBinding \"suggestedBindings\" is which not optional since \"countSuggestedBindings\" is set and must be non-NULL"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(local_188,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_180,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_90,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_90);
        std::__cxx11::string::~string((string *)&error_message);
        XVar2 = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      uVar5 = 0xffffffffffffffff;
      lVar3 = 0;
      XVar4 = XVar2;
      do {
        uVar5 = uVar5 + 1;
        if (value->countSuggestedBindings <= uVar5) {
          return XVar4;
        }
        XVar4 = XR_SUCCESS;
        XVar2 = ValidateXrStruct(local_188,local_180,local_178,true,false,
                                 (XrActionSuggestedBinding *)
                                 ((long)&value->suggestedBindings->action + lVar3));
        lVar3 = lVar3 + 0x10;
      } while (XVar2 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrInteractionProfileSuggestedBinding-suggestedBindings-parameter",
                 (allocator *)&local_e8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_a8,local_178);
      std::__cxx11::string::string
                ((string *)&local_168,
                 "Structure XrInteractionProfileSuggestedBinding member suggestedBindings is invalid"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_188,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_180,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_a8,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_a8);
      std::__cxx11::string::~string((string *)&error_message);
    }
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrInteractionProfileSuggestedBinding* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrInteractionProfileSuggestedBinding",
                             value->type, "VUID-XrInteractionProfileSuggestedBinding-type-type", XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING, "XR_TYPE_INTERACTION_PROFILE_SUGGESTED_BINDING");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_BINDING_MODIFICATIONS_KHR);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileSuggestedBinding-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrInteractionProfileSuggestedBinding struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrInteractionProfileSuggestedBinding : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileSuggestedBinding-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrInteractionProfileSuggestedBinding struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->countSuggestedBindings && nullptr != value->suggestedBindings) {
        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileSuggestedBinding-countSuggestedBindings-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInteractionProfileSuggestedBinding member countSuggestedBindings is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->suggestedBindings && 0 != value->countSuggestedBindings) {
        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileSuggestedBinding-suggestedBindings-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrInteractionProfileSuggestedBinding contains invalid NULL for XrActionSuggestedBinding \"suggestedBindings\" is which not "
                            "optional since \"countSuggestedBindings\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->suggestedBindings) {
        for (uint32_t value_suggestedbindings_inc = 0; value_suggestedbindings_inc < value->countSuggestedBindings; ++value_suggestedbindings_inc) {
            // Validate that the structure XrActionSuggestedBinding is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->suggestedBindings[value_suggestedbindings_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileSuggestedBinding-suggestedBindings-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrInteractionProfileSuggestedBinding member suggestedBindings is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}